

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O0

void anon_unknown.dwarf_20b0ad::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_3_2::Rgba> *p1,RgbaChannels channels
               ,Compression comp)

{
  bool bVar1;
  int iVar2;
  RgbaChannels RVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int *piVar7;
  Rgba *pRVar8;
  float *pfVar9;
  Vec2<float> *v;
  Array2D<Imf_3_2::Rgba> *in_RCX;
  int in_EDX;
  int in_ESI;
  char *pcVar10;
  char *in_RDI;
  RgbaChannels in_R8D;
  int in_R9D;
  float fVar11;
  float fVar12;
  int x;
  int y;
  ReaderThread reader2;
  ReaderThread reader1;
  Array2D<Imf_3_2::Rgba> p2;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile in;
  WriterThread writer2;
  WriterThread writer1;
  RgbaOutputFile out;
  Header header;
  undefined4 in_stack_fffffffffffffd50;
  float in_stack_fffffffffffffd54;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  RgbaInputFile *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined8 in_stack_fffffffffffffd88;
  RgbaChannels channels_00;
  int in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  Array2D<Imf_3_2::Rgba> *in_stack_fffffffffffffda0;
  int local_178;
  int local_174;
  Vec2<float> local_170 [9];
  Array2D<Imf_3_2::Rgba> local_128;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int *local_100;
  RgbaInputFile local_f8 [4];
  RgbaChannels in_stack_ffffffffffffff0c;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff10;
  Array2D<Imf_3_2::Rgba> *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  Rgba local_88 [5];
  Vec2<float> local_60;
  Header local_58 [56];
  int local_20;
  RgbaChannels local_1c;
  Array2D<Imf_3_2::Rgba> *local_18;
  int local_10;
  int local_c;
  char *local_8;
  
  channels_00 = (RgbaChannels)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar6 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar10 = "";
  if ((local_1c & WRITE_R) != 0) {
    pcVar10 = "R";
  }
  poVar6 = std::operator<<(poVar6,pcVar10);
  pcVar10 = "";
  if ((local_1c & WRITE_G) != 0) {
    pcVar10 = "G";
  }
  poVar6 = std::operator<<(poVar6,pcVar10);
  pcVar10 = "";
  if ((local_1c & WRITE_B) != 0) {
    pcVar10 = "B";
  }
  poVar6 = std::operator<<(poVar6,pcVar10);
  pcVar10 = "";
  if ((local_1c & WRITE_A) != 0) {
    pcVar10 = "A";
  }
  poVar6 = std::operator<<(poVar6,pcVar10);
  poVar6 = std::operator<<(poVar6,", compression ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_20);
  poVar6 = std::operator<<(poVar6,", ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  iVar2 = local_10;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_2::Header::Header
            (local_58,local_c,iVar2,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar7 = (int *)Imf_3_2::Header::compression();
  *piVar7 = local_20;
  remove(local_8);
  poVar6 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  pcVar10 = local_8;
  RVar3 = local_1c;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile((RgbaOutputFile *)local_88,pcVar10,local_58,RVar3,iVar2);
  pRVar8 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,0);
  Imf_3_2::RgbaOutputFile::setFrameBuffer(local_88,(ulong)pRVar8,1);
  (anonymous_namespace)::remainingScanlines = local_10;
  WriterThread::WriterThread
            ((WriterThread *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (RgbaOutputFile *)in_stack_fffffffffffffd58);
  WriterThread::WriterThread
            ((WriterThread *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (RgbaOutputFile *)in_stack_fffffffffffffd58);
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Semaphore::wait();
  WriterThread::~WriterThread((WriterThread *)0x21bdae);
  WriterThread::~WriterThread((WriterThread *)0x21bdbb);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_88);
  poVar6 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  pcVar10 = local_8;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile(local_f8,pcVar10,iVar2);
  local_100 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  local_104 = (local_100[2] - *local_100) + 1;
  local_108 = (local_100[3] - local_100[1]) + 1;
  local_10c = *local_100;
  local_110 = local_100[1];
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            (in_stack_fffffffffffffda0,CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
             ,CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  pRVar8 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)-local_110);
  Imf_3_2::RgbaInputFile::setFrameBuffer((Rgba *)local_f8,(ulong)(pRVar8 + -local_10c),1);
  ReaderThread::ReaderThread
            ((ReaderThread *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
  ReaderThread::ReaderThread
            ((ReaderThread *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,in_stack_fffffffffffffd60);
  IlmThread_3_2::Semaphore::wait();
  IlmThread_3_2::Semaphore::wait();
  ReaderThread::~ReaderThread((ReaderThread *)0x21bf7e);
  ReaderThread::~ReaderThread((ReaderThread *)0x21bf8b);
  Imf_3_2::RgbaInputFile::displayWindow();
  Imf_3_2::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
  if (!bVar1) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,199,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  Imf_3_2::RgbaInputFile::dataWindow();
  Imf_3_2::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58);
  if (!bVar1) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,200,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  fVar11 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
  pfVar9 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar11 != *pfVar9) || (NAN(fVar11) || NAN(*pfVar9))) {
    __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,0xc9,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  Imf_3_2::RgbaInputFile::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  bVar1 = Imath_3_2::Vec2<float>::operator==(local_170,v);
  if (!bVar1) {
    __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,0xca,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  fVar11 = (float)Imf_3_2::RgbaInputFile::screenWindowWidth();
  pfVar9 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar11 != *pfVar9) || (NAN(fVar11) || NAN(*pfVar9))) {
    __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,0xcb,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  iVar2 = Imf_3_2::RgbaInputFile::lineOrder();
  piVar7 = (int *)Imf_3_2::Header::lineOrder();
  if (iVar2 != *piVar7) {
    __assert_fail("in.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                  ,0xcc,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                 );
  }
  iVar2 = Imf_3_2::RgbaInputFile::compression();
  piVar7 = (int *)Imf_3_2::Header::compression();
  if (iVar2 == *piVar7) {
    RVar3 = Imf_3_2::RgbaInputFile::channels();
    if (RVar3 != local_1c) {
      __assert_fail("in.channels () == channels",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                    ,0xce,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                   );
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"comparing ");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    iVar2 = Imf_3_2::RgbaInputFile::compression();
    if ((iVar2 == 6) || (iVar4 = Imf_3_2::RgbaInputFile::compression(), iVar4 == 7)) {
      compareB44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    }
    else {
      iVar5 = Imf_3_2::RgbaInputFile::compression();
      if ((iVar5 == 8) ||
         (in_stack_fffffffffffffd90 = Imf_3_2::RgbaInputFile::compression(),
         in_stack_fffffffffffffd90 == 9)) {
        compareDwa((int)((ulong)poVar6 >> 0x20),(int)poVar6,
                   (Array2D<Imf_3_2::Rgba> *)CONCAT44(iVar2,iVar4),
                   (Array2D<Imf_3_2::Rgba> *)CONCAT44(iVar5,in_stack_fffffffffffffd90),channels_00);
      }
      else {
        for (local_174 = 0; local_174 < local_108; local_174 = local_174 + 1) {
          for (local_178 = 0; local_178 < local_104; local_178 = local_178 + 1) {
            if ((local_1c & WRITE_R) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((fVar11 != 0.0) || (NAN(fVar11))) {
                __assert_fail("p2[y][x].r == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xe6,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_174);
              fVar12 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xe4,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
            if ((local_1c & WRITE_G) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((fVar11 != 0.0) || (NAN(fVar11))) {
                __assert_fail("p2[y][x].g == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xeb,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_174);
              fVar12 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xe9,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
            if ((local_1c & WRITE_B) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((fVar11 != 0.0) || (NAN(fVar11))) {
                __assert_fail("p2[y][x].b == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xf0,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_174);
              fVar12 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xee,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
            if ((local_1c & WRITE_A) == 0) {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((fVar11 != 1.0) || (NAN(fVar11))) {
                __assert_fail("p2[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xf5,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
            else {
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_128,(long)local_174);
              in_stack_fffffffffffffd54 =
                   Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
              ;
              Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](local_18,(long)local_174);
              fVar11 = Imath_3_2::half::operator_cast_to_float
                                 ((half *)CONCAT44(in_stack_fffffffffffffd54,
                                                   in_stack_fffffffffffffd50));
              if ((in_stack_fffffffffffffd54 != fVar11) ||
                 (NAN(in_stack_fffffffffffffd54) || NAN(fVar11))) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                              ,0xf3,
                              "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
                             );
              }
            }
          }
        }
      }
    }
    Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
              ((Array2D<Imf_3_2::Rgba> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    Imf_3_2::RgbaInputFile::~RgbaInputFile(local_f8);
    remove(local_8);
    Imf_3_2::Header::~Header(local_58);
    return;
  }
  __assert_fail("in.compression () == header.compression ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testSharedFrameBuffer.cpp"
                ,0xcd,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, Compression)"
               );
}

Assistant:

void
writeReadRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    RgbaChannels         channels,
    Compression          comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & WRITE_R) ? "R" : "")
         << ((channels & WRITE_G) ? "G" : "")
         << ((channels & WRITE_B) ? "B" : "")
         << ((channels & WRITE_A) ? "A" : "") << ", compression " << comp
         << ", " << flush;

    Header header (width, height);
    header.compression () = comp;

    {
        remove (fileName);
        cout << "writing " << flush;
        RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);

        remainingScanlines = height;
        WriterThread writer1 (&out);
        WriterThread writer2 (&out);
        threadSemaphore.wait ();
        threadSemaphore.wait ();
    }

    {
        cout << "reading " << flush;
        RgbaInputFile in (fileName);
        const Box2i&  dw = in.dataWindow ();

        int w  = dw.max.x - dw.min.x + 1;
        int h  = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);

        {
            ReaderThread reader1 (&in, 0, 2);
            ReaderThread reader2 (&in, 1, 2);
            threadSemaphore.wait ();
            threadSemaphore.wait ();
        }

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        cout << "comparing " << endl;

        if (in.compression () == B44_COMPRESSION ||
            in.compression () == B44A_COMPRESSION)
        {
            compareB44 (width, height, p1, p2, channels);
        }
        else if (
            in.compression () == DWAA_COMPRESSION ||
            in.compression () == DWAB_COMPRESSION)
        {
            compareDwa (width, height, p1, p2, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    if (channels & WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (p2[y][x].r == 0);

                    if (channels & WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (p2[y][x].g == 0);

                    if (channels & WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (p2[y][x].b == 0);

                    if (channels & WRITE_A)
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (p2[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName);
}